

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O0

void __thiscall icu_63::ICUService::~ICUService(ICUService *this)

{
  Mutex local_18;
  Mutex mutex;
  ICUService *this_local;
  
  (this->super_ICUNotifier)._vptr_ICUNotifier = (_func_int **)&PTR__ICUService_004a3030;
  mutex.fMutex = (UMutex *)this;
  Mutex::Mutex(&local_18,(UMutex *)icu_63::lock);
  (*(this->super_ICUNotifier)._vptr_ICUNotifier[0x12])();
  if (this->factories != (UVector *)0x0) {
    (*(this->factories->super_UObject)._vptr_UObject[1])();
  }
  this->factories = (UVector *)0x0;
  Mutex::~Mutex(&local_18);
  UnicodeString::~UnicodeString(&this->name);
  ICUNotifier::~ICUNotifier(&this->super_ICUNotifier);
  return;
}

Assistant:

ICUService::~ICUService()
{
    {
        Mutex mutex(&lock);
        clearCaches();
        delete factories;
        factories = NULL;
    }
}